

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::CropParameter::Clear(CropParameter *this)

{
  (this->offset_).current_size_ = 0;
  this->axis_ = 2;
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void CropParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.CropParameter)
  offset_.Clear();
  axis_ = 2;
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}